

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textfile.h
# Opt level: O3

bool __thiscall TextFile::readLine(TextFile *this,string *line)

{
  ssize_t sVar1;
  char *__nbytes;
  char ch;
  char local_19;
  
  __nbytes = "";
  std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,0x20a226);
  sVar1 = File::read(&this->super_File,(int)&local_19,(void *)0x1,(size_t)__nbytes);
  if ((int)sVar1 != 1) {
    return false;
  }
  while ((local_19 == '\r' || (local_19 == '\n'))) {
    sVar1 = File::read(&this->super_File,(int)&local_19,(void *)0x1,(size_t)__nbytes);
    if ((int)sVar1 != 1) {
      return false;
    }
  }
  std::__cxx11::string::push_back((char)line);
  sVar1 = File::read(&this->super_File,(int)&local_19,(void *)0x1,(size_t)__nbytes);
  if ((int)sVar1 == 1) {
    do {
      if ((local_19 == '\n') || (local_19 == '\r')) {
        return true;
      }
      std::__cxx11::string::push_back((char)line);
      sVar1 = File::read(&this->super_File,(int)&local_19,(void *)0x1,(size_t)__nbytes);
    } while ((int)sVar1 == 1);
  }
  return line->_M_string_length != 0;
}

Assistant:

bool readLine(std::string& line) const
    {
        line = "";
        char ch;
        int readCnt;
        do
        {
            readCnt = read(&ch, 1);
        } while (readCnt == 1 && (ch == '\n' || ch == '\r'));
        if (readCnt != 1)
            return false;
        if (ch != '\n' && ch != '\r')
            line += ch;
        while (true)
        {
            readCnt = read(&ch, 1);
            if (readCnt == 1 && ch != '\n' && ch != '\r')
                line += ch;
            else
                break;
        }
        return readCnt == 1 || !line.empty();
    }